

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int write_hdr_to_file(nifti_1_header *nhdr,char *fname)

{
  int use_compression;
  size_t sVar1;
  uint uVar2;
  znzFile fp;
  char func [18];
  
  builtin_strncpy(func,"write_hdr_to_file",0x12);
  use_compression = nifti_is_gzfile(fname);
  fp = znzopen(fname,"r+b",use_compression);
  if (fp == (znzFile)0x0) {
    fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",func,"failed to re-open mod file",fname);
    uVar2 = 1;
  }
  else {
    sVar1 = znzwrite(nhdr,1,0x15c,fp);
    if (sVar1 != 0x15c) {
      fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",func,"failed to write header to file",fname);
      fprintf(_stderr,"  - wrote %d of %d bytes\n",sVar1 & 0xffffffff,0x15c);
    }
    uVar2 = (uint)(sVar1 != 0x15c);
    if (3 < g_debug) {
      disp_nifti_1_header("+d writing new header to file : ",nhdr);
    }
    Xznzclose(&fp);
  }
  return uVar2;
}

Assistant:

int write_hdr_to_file( nifti_1_header * nhdr, char * fname )
{
   znzFile fp;
   size_t  bytes;
   char    func[] = { "write_hdr_to_file" };
   int     rv = 0;

   fp = znzopen(fname,"r+b",nifti_is_gzfile(fname));
   if( znz_isnull(fp) ){
      NTL_FERR(func, "failed to re-open mod file", fname);
      return 1;
   }

   bytes = znzwrite(nhdr, 1, sizeof(nifti_1_header), fp);
   if( bytes != sizeof(nifti_1_header)){
      NTL_FERR(func, "failed to write header to file",fname);
      fprintf(stderr,"  - wrote %d of %d bytes\n",
              (int)bytes,(int)sizeof(nifti_1_header));
      rv = 1;
   }

   if( g_debug > 3 )
      disp_nifti_1_header("+d writing new header to file : ", nhdr);

   znzclose(fp);

   return rv;
}